

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O0

void __thiscall inja::Renderer::visit(Renderer *this,BlockStatementNode *node)

{
  bool bVar1;
  reference ppTVar2;
  const_iterator __addr_len;
  pointer ppVar3;
  element_type *peVar4;
  sockaddr *__addr;
  BlockStatementNode *local_38;
  _Self local_30;
  _Self local_28;
  const_iterator block_it;
  size_t old_level;
  BlockStatementNode *node_local;
  Renderer *this_local;
  
  block_it._M_node = (_Base_ptr)this->current_level;
  this->current_level = 0;
  ppTVar2 = std::vector<const_inja::Template_*,_std::allocator<const_inja::Template_*>_>::front
                      (&this->template_stack);
  this->current_template = *ppTVar2;
  __addr_len = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>_>
               ::find(&this->current_template->block_storage,&node->name);
  local_28._M_node = __addr_len._M_node;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>_>
       ::end(&this->current_template->block_storage);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    local_38 = node;
    ::std::vector<inja::BlockStatementNode_const*,std::allocator<inja::BlockStatementNode_const*>>::
    emplace_back<inja::BlockStatementNode_const*>
              ((vector<inja::BlockStatementNode_const*,std::allocator<inja::BlockStatementNode_const*>>
                *)&this->block_statement_stack,&local_38);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>
             ::operator->(&local_28);
    peVar4 = std::
             __shared_ptr_access<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&ppVar3->second);
    BlockNode::accept(&peVar4->block,(int)this,__addr,&(__addr_len._M_node)->_M_color);
    std::vector<const_inja::BlockStatementNode_*,_std::allocator<const_inja::BlockStatementNode_*>_>
    ::pop_back(&this->block_statement_stack);
  }
  this->current_level = (size_t)block_it._M_node;
  ppTVar2 = std::vector<const_inja::Template_*,_std::allocator<const_inja::Template_*>_>::back
                      (&this->template_stack);
  this->current_template = *ppTVar2;
  return;
}

Assistant:

void visit(const BlockStatementNode& node) {
    const size_t old_level = current_level;
    current_level = 0;
    current_template = template_stack.front();
    const auto block_it = current_template->block_storage.find(node.name);
    if (block_it != current_template->block_storage.end()) {
      block_statement_stack.emplace_back(&node);
      block_it->second->block.accept(*this);
      block_statement_stack.pop_back();
    }
    current_level = old_level;
    current_template = template_stack.back();
  }